

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppLog(bool *p_open)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  ImGuiIO *pIVar4;
  double dVar5;
  undefined8 local_58;
  char *random_words [7];
  float time;
  bool *p_open_local;
  
  if (ShowExampleAppLog(bool*)::log == '\0') {
    iVar2 = __cxa_guard_acquire(&ShowExampleAppLog(bool*)::log);
    if (iVar2 != 0) {
      ExampleAppLog::ExampleAppLog(&ShowExampleAppLog::log);
      __cxa_atexit(ExampleAppLog::~ExampleAppLog,&ShowExampleAppLog::log,&__dso_handle);
      __cxa_guard_release(&ShowExampleAppLog(bool*)::log);
    }
  }
  random_words[6]._0_4_ = ImGui::GetTime();
  if (0.2 <= random_words[6]._0_4_ - ShowExampleAppLog::last_time) {
    pIVar4 = ImGui::GetIO();
    if ((pIVar4->KeyCtrl & 1U) == 0) {
      memcpy(&local_58,&DAT_00290c60,0x38);
      iVar2 = rand();
      pcVar1 = random_words[(long)(iVar2 % 7) + -1];
      dVar5 = (double)random_words[6]._0_4_;
      uVar3 = rand();
      ExampleAppLog::AddLog
                (&ShowExampleAppLog::log,"[%s] Hello, time is %.1f, rand() %d\n",dVar5,pcVar1,
                 (ulong)uVar3);
      ShowExampleAppLog::last_time = random_words[6]._0_4_;
    }
  }
  ExampleAppLog::Draw(&ShowExampleAppLog::log,"Example: Log",p_open);
  return;
}

Assistant:

static void ShowExampleAppLog(bool* p_open)
{
    static ExampleAppLog log;

    // Demo: add random items (unless Ctrl is held)
    static float last_time = -1.0f;
    float time = ImGui::GetTime();
    if (time - last_time >= 0.20f && !ImGui::GetIO().KeyCtrl)
    {
        const char* random_words[] = { "system", "info", "warning", "error", "fatal", "notice", "log" };
        log.AddLog("[%s] Hello, time is %.1f, rand() %d\n", random_words[rand() % IM_ARRAYSIZE(random_words)], time, (int)rand());
        last_time = time;
    }

    log.Draw("Example: Log", p_open);
}